

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall
tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
          (ConstPixelBufferAccess *this,TextureLevel *level)

{
  TextureFormat TVar1;
  IVec3 *v;
  void *pvVar2;
  TextureLevel *level_local;
  ConstPixelBufferAccess *this_local;
  
  TVar1 = TextureLevel::getFormat(level);
  this->m_format = TVar1;
  v = TextureLevel::getSize(level);
  Vector<int,_3>::Vector(&this->m_size,v);
  calculatePackedPitch((tcu *)&this->m_pitch,&this->m_format,&this->m_size);
  pvVar2 = TextureLevel::getPtr(level);
  this->m_data = pvVar2;
  return;
}

Assistant:

ConstPixelBufferAccess::ConstPixelBufferAccess (const TextureLevel& level)
	: m_format		(level.getFormat())
	, m_size		(level.getSize())
	, m_pitch		(calculatePackedPitch(m_format, m_size))
	, m_data		((void*)level.getPtr())
{
}